

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

int secp256k1_musig_nonce_process
              (secp256k1_context *ctx,secp256k1_musig_session *session,
              secp256k1_musig_aggnonce *aggnonce,uchar *msg32,
              secp256k1_musig_keyagg_cache *keyagg_cache)

{
  int iVar1;
  undefined4 extraout_EAX;
  long lVar2;
  secp256k1_ge *psVar3;
  void *pvVar4;
  secp256k1_ge *psVar5;
  char *pcVar6;
  byte bVar7;
  undefined1 auVar8 [16];
  uchar fin_nonce [32];
  uchar agg_pk32 [32];
  secp256k1_ge fin_nonce_pt;
  secp256k1_scalar e_tmp;
  byte local_290;
  secp256k1_scalar local_268;
  secp256k1_scalar local_248;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  uchar noncehash [32];
  secp256k1_keyagg_cache_internal cache_i;
  secp256k1_ge aggnonce_pts [2];
  
  bVar7 = 0;
  if (session == (secp256k1_musig_session *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar6 = "session != NULL";
  }
  else if (aggnonce == (secp256k1_musig_aggnonce *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar6 = "aggnonce != NULL";
  }
  else if (msg32 == (uchar *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar6 = "msg32 != NULL";
  }
  else {
    if (keyagg_cache != (secp256k1_musig_keyagg_cache *)0x0) {
      iVar1 = secp256k1_keyagg_cache_load(ctx,&cache_i,keyagg_cache);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_fe_impl_get_b32(agg_pk32,(secp256k1_fe *)&cache_i);
      iVar1 = secp256k1_musig_aggnonce_load(ctx,aggnonce_pts,aggnonce);
      if (iVar1 == 0) {
        return 0;
      }
      e_tmp.d[0] = 0x6bf7e532c7d5a45;
      e_tmp.d[1] = 0x971254c089be68a6;
      e_tmp.d[2] = 0x72846dcd60ac12d2;
      e_tmp.d[3] = 0xde7a25006c81212f;
      for (lVar2 = 0; lVar2 != 0xb0; lVar2 = lVar2 + 0x58) {
        secp256k1_musig_ge_serialize_ext
                  ((uchar *)&fin_nonce_pt,(secp256k1_ge *)((long)aggnonce_pts[0].x.n + lVar2));
        secp256k1_sha256_write((secp256k1_sha256 *)&e_tmp,(uchar *)&fin_nonce_pt,0x21);
      }
      secp256k1_sha256_write((secp256k1_sha256 *)&e_tmp,agg_pk32,0x20);
      secp256k1_sha256_write((secp256k1_sha256 *)&e_tmp,msg32,0x20);
      secp256k1_sha256_finalize((secp256k1_sha256 *)&e_tmp,noncehash);
      secp256k1_scalar_set_b32(&local_268,noncehash,(int *)0x0);
      secp256k1_effective_nonce((secp256k1_gej *)&e_tmp,aggnonce_pts,&local_268);
      secp256k1_ge_set_gej(&fin_nonce_pt,(secp256k1_gej *)&e_tmp);
      if (fin_nonce_pt.infinity != 0) {
        psVar3 = &secp256k1_ge_const_g;
        psVar5 = &fin_nonce_pt;
        for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
          (psVar5->x).n[0] = (psVar3->x).n[0];
          psVar3 = (secp256k1_ge *)((long)psVar3 + ((ulong)bVar7 * -2 + 1) * 8);
          psVar5 = (secp256k1_ge *)((long)psVar5 + (ulong)bVar7 * -0x10 + 8);
        }
      }
      secp256k1_fe_impl_normalize_var(&fin_nonce_pt.x);
      secp256k1_fe_impl_get_b32(fin_nonce,&fin_nonce_pt.x);
      secp256k1_fe_impl_normalize_var(&fin_nonce_pt.y);
      local_290 = (byte)fin_nonce_pt.y.n[0] & 1;
      secp256k1_schnorrsig_challenge(&local_248,fin_nonce,msg32,0x20,agg_pk32);
      local_218 = (undefined1  [16])0x0;
      local_228 = (undefined1  [16])0x0;
      auVar8._0_4_ = -(uint)((int)cache_i.tweak.d[2] == 0 && (int)cache_i.tweak.d[0] == 0);
      auVar8._4_4_ = -(uint)(cache_i.tweak.d[2]._4_4_ == 0 && cache_i.tweak.d[0]._4_4_ == 0);
      auVar8._8_4_ = -(uint)((int)cache_i.tweak.d[3] == 0 && (int)cache_i.tweak.d[1] == 0);
      auVar8._12_4_ = -(uint)(cache_i.tweak.d[3]._4_4_ == 0 && cache_i.tweak.d[1]._4_4_ == 0);
      iVar1 = movmskps(extraout_EAX,auVar8);
      if (iVar1 != 0xf) {
        secp256k1_scalar_mul(&e_tmp,&local_248,&cache_i.tweak);
        if (((byte)cache_i.pk.y.n[0] & 1) != 0) {
          secp256k1_scalar_negate(&e_tmp,&e_tmp);
        }
        local_218._8_8_ = e_tmp.d[3];
        local_218._0_8_ = e_tmp.d[2];
        local_228._8_8_ = e_tmp.d[1];
        local_228._0_8_ = e_tmp.d[0];
      }
      session->data[0] = 0x9d;
      session->data[1] = 0xed;
      session->data[2] = 0xe9;
      session->data[3] = '\x17';
      session->data[4] = local_290;
      *(undefined8 *)(session->data + 5) = fin_nonce._0_8_;
      *(undefined8 *)(session->data + 0xd) = fin_nonce._8_8_;
      *(undefined8 *)(session->data + 0x15) = fin_nonce._16_8_;
      *(undefined8 *)(session->data + 0x1d) = fin_nonce._24_8_;
      secp256k1_scalar_get_b32(session->data + 0x25,&local_268);
      secp256k1_scalar_get_b32(session->data + 0x45,&local_248);
      secp256k1_scalar_get_b32(session->data + 0x65,(secp256k1_scalar *)local_228);
      return 1;
    }
    pvVar4 = (ctx->illegal_callback).data;
    pcVar6 = "keyagg_cache != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar6,pvVar4);
  return 0;
}

Assistant:

int secp256k1_musig_nonce_process(const secp256k1_context* ctx, secp256k1_musig_session *session, const secp256k1_musig_aggnonce  *aggnonce, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache) {
    secp256k1_keyagg_cache_internal cache_i;
    secp256k1_ge aggnonce_pts[2];
    unsigned char fin_nonce[32];
    secp256k1_musig_session_internal session_i;
    unsigned char agg_pk32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(session != NULL);
    ARG_CHECK(aggnonce != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(keyagg_cache != NULL);

    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        return 0;
    }
    secp256k1_fe_get_b32(agg_pk32, &cache_i.pk.x);

    if (!secp256k1_musig_aggnonce_load(ctx, aggnonce_pts, aggnonce)) {
        return 0;
    }

    secp256k1_musig_nonce_process_internal(&session_i.fin_nonce_parity, fin_nonce, &session_i.noncecoef, aggnonce_pts, agg_pk32, msg32);
    secp256k1_schnorrsig_challenge(&session_i.challenge, fin_nonce, msg32, 32, agg_pk32);

    /* If there is a tweak then set `challenge` times `tweak` to the `s`-part.*/
    secp256k1_scalar_set_int(&session_i.s_part, 0);
    if (!secp256k1_scalar_is_zero(&cache_i.tweak)) {
        secp256k1_scalar e_tmp;
        secp256k1_scalar_mul(&e_tmp, &session_i.challenge, &cache_i.tweak);
        if (secp256k1_fe_is_odd(&cache_i.pk.y)) {
            secp256k1_scalar_negate(&e_tmp, &e_tmp);
        }
        session_i.s_part = e_tmp;
    }
    memcpy(session_i.fin_nonce, fin_nonce, sizeof(session_i.fin_nonce));
    secp256k1_musig_session_save(session, &session_i);
    return 1;
}